

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::AccessibilityString(uint Access)

{
  undefined1 auStack_18 [4];
  uint Access_local;
  
  if (Access == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_ACCESS_public");
  }
  else if (Access == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_ACCESS_protected");
  }
  else if (Access == 3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_ACCESS_private");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::AccessibilityString(unsigned Access) {
  switch (Access) {
  // Accessibility codes
  case DW_ACCESS_public:
    return "DW_ACCESS_public";
  case DW_ACCESS_protected:
    return "DW_ACCESS_protected";
  case DW_ACCESS_private:
    return "DW_ACCESS_private";
  }
  return StringRef();
}